

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimalControlProblem.cpp
# Opt level: O2

bool __thiscall
iDynTree::optimalcontrol::OptimalControlProblem::constraintsSecondPartialDerivativeWRTControl
          (OptimalControlProblem *this,double time,VectorDynSize *state,VectorDynSize *control,
          VectorDynSize *lambda,MatrixDynSize *hessian)

{
  OptimalControlProblemPimpl *pOVar1;
  undefined8 *puVar2;
  bool bVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  _Base_ptr p_Var8;
  ostream *poVar9;
  bool bVar10;
  ostringstream errorMsg;
  string local_210;
  MatrixDynSize *local_1f0;
  _Rb_tree_node_base *local_1e8;
  VectorDynSize *local_1e0;
  double local_1d8;
  VectorDynSize *local_1d0;
  VectorDynSize *local_1c8;
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> local_1c0;
  undefined1 local_1a8 [32];
  size_type sStack_188;
  char local_180;
  long local_178;
  size_type local_168;
  
  local_1d8 = time;
  local_1d0 = state;
  local_1c8 = lambda;
  lVar5 = iDynTree::MatrixDynSize::rows();
  lVar6 = iDynTree::VectorDynSize::size();
  if (lVar5 == lVar6) {
    lVar5 = iDynTree::MatrixDynSize::cols();
    lVar6 = iDynTree::VectorDynSize::size();
    if (lVar5 == lVar6) goto LAB_00182265;
  }
  uVar7 = iDynTree::VectorDynSize::size();
  iDynTree::VectorDynSize::size();
  iDynTree::MatrixDynSize::resize((ulong)hessian,uVar7);
LAB_00182265:
  pOVar1 = this->m_pimpl;
  if ((pOVar1->constraintsGroups)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    iDynTree::MatrixDynSize::zero();
  }
  else {
    p_Var8 = (pOVar1->constraintsGroups)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_1e8 = &(pOVar1->constraintsGroups)._M_t._M_impl.super__Rb_tree_header._M_header;
    lVar5 = 0;
    bVar10 = true;
    local_1f0 = hessian;
    local_1e0 = control;
    while (p_Var8 != local_1e8) {
      toEigen((Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)
              &local_210,local_1c8);
      uVar4 = ConstraintsGroup::constraintsDimension
                        ((ConstraintsGroup *)**(undefined8 **)(p_Var8 + 2));
      local_1a8._0_8_ = local_210._M_dataplus._M_p + lVar5 * 8;
      local_1a8._8_8_ = ZEXT48(uVar4);
      local_180 = local_210.field_2._M_local_buf[0];
      local_1a8._24_8_ = local_210._M_dataplus._M_p;
      sStack_188 = local_210._M_string_length;
      local_168 = local_210._M_string_length;
      local_178 = lVar5;
      toEigen(&local_1c0,(VectorDynSize *)(*(long *)(p_Var8 + 2) + 0xf8));
      Eigen::internal::
      call_assignment<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>,Eigen::Block<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::Stride<0,0>>,_1,1,false>>
                (&local_1c0,
                 (Block<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false>
                  *)local_1a8);
      puVar2 = *(undefined8 **)(p_Var8 + 2);
      bVar3 = ConstraintsGroup::constraintSecondPartialDerivativeWRTControl
                        ((ConstraintsGroup *)*puVar2,local_1d8,local_1d0,local_1e0,
                         (VectorDynSize *)(puVar2 + 0x1f),(MatrixDynSize *)(puVar2 + 0x15));
      if (!bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        poVar9 = std::operator<<((ostream *)local_1a8,"Error while evaluating constraint ");
        ConstraintsGroup::name_abi_cxx11_
                  (&local_210,(ConstraintsGroup *)**(undefined8 **)(p_Var8 + 2));
        poVar9 = std::operator<<(poVar9,(string *)&local_210);
        std::operator<<(poVar9,".");
        std::__cxx11::string::~string((string *)&local_210);
        std::__cxx11::stringbuf::str();
        iDynTree::reportError
                  ("OptimalControlProblem","constraintSecondPartialDerivativeWRTControl",
                   local_210._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&local_210);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        return false;
      }
      if (bVar10) {
        toEigen((Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> *)local_1a8,
                (MatrixDynSize *)(*(long *)(p_Var8 + 2) + 0xa8));
        toEigen((Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> *)&local_210
                ,local_1f0);
        Eigen::internal::
        call_assignment<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>>
                  ((Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> *)
                   &local_210,
                   (Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> *)
                   local_1a8);
      }
      else {
        toEigen((Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> *)local_1a8,
                (MatrixDynSize *)(*(long *)(p_Var8 + 2) + 0xa8));
        toEigen((Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> *)&local_210
                ,local_1f0);
        Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>>::
        operator+=((MatrixBase<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>>
                    *)&local_210,
                   (MatrixBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                    *)local_1a8);
      }
      uVar4 = ConstraintsGroup::constraintsDimension
                        ((ConstraintsGroup *)**(undefined8 **)(p_Var8 + 2));
      lVar5 = lVar5 + (ulong)uVar4;
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
      bVar10 = false;
    }
  }
  return true;
}

Assistant:

bool OptimalControlProblem::constraintsSecondPartialDerivativeWRTControl(double time, const VectorDynSize &state, const VectorDynSize &control, const VectorDynSize &lambda, MatrixDynSize &hessian)
        {
            if ((hessian.rows() != control.size()) || (hessian.cols() != control.size())) {
                hessian.resize(control.size(), control.size());
            }

            if (m_pimpl->constraintsGroups.size() == 0) {
                hessian.zero();
                return true;
            }

            bool first = true;
            Eigen::Index offset = 0;

            for (auto& group : m_pimpl->constraintsGroups){
                toEigen(group.second->lambdaBuffer) = toEigen(lambda).segment(offset, group.second->group_ptr->constraintsDimension());
                if (! group.second->group_ptr->constraintSecondPartialDerivativeWRTControl(time, state, control, group.second->lambdaBuffer, group.second->controlHessianBuffer)){
                    std::ostringstream errorMsg;
                    errorMsg << "Error while evaluating constraint " << group.second->group_ptr->name() <<".";
                    reportError("OptimalControlProblem", "constraintSecondPartialDerivativeWRTControl", errorMsg.str().c_str());
                    return false;
                }
                if (first){
                    toEigen(hessian) = toEigen(group.second->controlHessianBuffer);
                    first = false;
                } else {
                    toEigen(hessian) += toEigen(group.second->controlHessianBuffer);
                }
                offset += group.second->group_ptr->constraintsDimension();
            }
            return true;
        }